

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transform.cpp
# Opt level: O0

void parallel_transform<std::vector<int,std::allocator<int>>,tf::GuidedPartitioner<tf::DefaultClosureWrapper>>
               (size_t W)

{
  code *pcVar1;
  bool bVar2;
  byte extraout_AL;
  time_t tVar3;
  char **__stat_loc;
  undefined8 in_RDI;
  double __x;
  Expression_lhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  EVar4;
  ResultBuilder DOCTEST_RB;
  iterator d_itr;
  iterator s_itr;
  Task to;
  Task from;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tgt;
  vector<int,_std::allocator<int>_> src;
  iterator tgt_beg;
  const_iterator src_end;
  const_iterator src_beg;
  size_t c;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<int> *__range2;
  size_t N;
  Executor executor;
  Taskflow taskflow;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  Enum in_stack_fffffffffffffb84;
  Executor *in_stack_fffffffffffffb88;
  vector<int,_std::allocator<int>_> *this;
  undefined8 uVar5;
  Taskflow *in_stack_fffffffffffffba0;
  ResultBuilder *this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_458;
  Executor *in_stack_fffffffffffffbb0;
  anon_class_48_6_c0e1b691 *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  ExpressionDecomposer local_414;
  Executor *local_410;
  Enum local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  Expression_lhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_360;
  int *local_358;
  __basic_future<void> local_350 [2];
  undefined8 local_330;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_318;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *local_310;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *local_308;
  FlowBuilder local_300;
  undefined1 *local_2f8;
  ulong *local_2f0;
  undefined1 *local_2e8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *local_2e0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *local_2d8;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2d0;
  undefined1 local_2c0 [24];
  undefined1 local_2a8 [24];
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_290;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_288;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_280;
  long local_278;
  int *local_270;
  int *local_268;
  int local_25c [5];
  initializer_list<int> local_248;
  initializer_list<int> *local_238;
  ulong local_230 [3];
  ResultBuilder local_218 [2];
  undefined1 local_d0 [200];
  undefined8 local_8;
  
  this = (vector<int,_std::allocator<int>_> *)0x0;
  local_8 = in_RDI;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffba0);
  this_00 = local_218;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),in_stack_fffffffffffffb78
            );
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffc68);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x12dd6b);
  local_230[0] = 0;
  uVar5 = local_8;
  do {
    if (999 < local_230[0]) {
      tf::Executor::~Executor(in_stack_fffffffffffffbb0);
      tf::Taskflow::~Taskflow
                ((Taskflow *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      return;
    }
    local_25c[0] = 0;
    local_25c[1] = 1;
    local_25c[2] = 3;
    local_25c[3] = 7;
    local_25c[4] = 99;
    local_248._M_array = local_25c;
    local_248._M_len = 5;
    local_238 = &local_248;
    local_268 = std::initializer_list<int>::begin(local_238);
    local_270 = std::initializer_list<int>::end
                          ((initializer_list<int> *)
                           CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
    for (; local_268 != local_270; local_268 = local_268 + 1) {
      local_278 = (long)*local_268;
      tf::Taskflow::clear((Taskflow *)0x12de40);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
      __normal_iterator(&local_280);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
      __normal_iterator(&local_288);
      std::
      _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_List_iterator(&local_290);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x12de76);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x12de83);
      tf::Taskflow::clear((Taskflow *)0x12de90);
      local_2f8 = local_2a8;
      local_2f0 = local_230;
      local_2e8 = local_2c0;
      local_2e0 = &local_280;
      local_2d8 = &local_288;
      local_2d0 = &local_290;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_transform_cpp:33:36),_nullptr>
                ((FlowBuilder *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                 in_stack_fffffffffffffbc0);
      local_308 = (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                  std::
                  ref<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)in_stack_fffffffffffffb78);
      local_310 = (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                  std::
                  ref<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)in_stack_fffffffffffffb78);
      local_318 = (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)std::ref<std::_List_iterator<std::__cxx11::string>>
                               ((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_fffffffffffffb78);
      tf::GuidedPartitioner<tf::DefaultClosureWrapper>::GuidedPartitioner
                ((GuidedPartitioner<tf::DefaultClosureWrapper> *)
                 CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                 (size_t)in_stack_fffffffffffffb78);
      tf::FlowBuilder::
      transform<std::reference_wrapper<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::reference_wrapper<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::reference_wrapper<std::_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_transform_cpp:46:9),_tf::GuidedPartitioner<tf::DefaultClosureWrapper>,_nullptr>
                (&local_300,local_d0,local_308,local_310,local_318,local_330);
      tf::Task::precede<tf::Task&>
                ((Task *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                 (Task *)in_stack_fffffffffffffb78);
      __stat_loc = &local_218[0].super_AssertData.m_file;
      tf::Executor::run(in_stack_fffffffffffffb88,
                        (Taskflow *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      std::__basic_future<void>::wait(local_350,__stat_loc);
      tf::Future<void>::~Future
                ((Future<void> *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      local_358 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb78);
      local_360._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffb78);
      while( true ) {
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb78);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           in_stack_fffffffffffffb78);
        if (!bVar2) break;
        in_stack_fffffffffffffb78 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1af791;
        doctest::detail::ResultBuilder::ResultBuilder
                  (this_00,(Enum)((ulong)uVar5 >> 0x20),(char *)this,
                   (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),"",
                   (char *)in_stack_fffffffffffffbb0);
        doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_414,DT_REQUIRE);
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_360,0);
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x12e0b2);
        EVar4 = doctest::detail::ExpressionDecomposer::
                operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                          ((ExpressionDecomposer *)
                           CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                           in_stack_fffffffffffffb78);
        in_stack_fffffffffffffb88 = (Executor *)EVar4.lhs;
        in_stack_fffffffffffffb84 = EVar4.m_at;
        local_410 = in_stack_fffffffffffffb88;
        local_408 = in_stack_fffffffffffffb84;
        local_458 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               in_stack_fffffffffffffb88,in_stack_fffffffffffffb84);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                  (&local_458);
        std::__cxx11::to_string(in_stack_fffffffffffffbcc);
        doctest::detail::Expression_lhs<std::__cxx11::string_const&>::operator==
                  (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
        doctest::detail::ResultBuilder::setResult
                  ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   (Result *)in_stack_fffffffffffffb78);
        doctest::detail::Result::~Result((Result *)0x12e15d);
        __x = (double)std::__cxx11::string::~string((string *)&stack0xfffffffffffffbb0);
        doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffc20,__x);
        in_stack_fffffffffffffb80 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffffb80);
        if ((extraout_AL & 1) != 0) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        doctest::detail::ResultBuilder::react
                  ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
        doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x12e2d5);
      }
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x12e2f8);
      std::vector<int,_std::allocator<int>_>::~vector(this);
    }
    local_230[0] = (local_230[0] + 1) * 2;
  } while( true );
}

Assistant:

void parallel_transform(size_t W) {

  std::srand(static_cast<unsigned int>(time(NULL)));

  tf::Taskflow taskflow;
  tf::Executor executor(W);

  for(size_t N=0; N<1000; N=(N+1)*2) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      taskflow.clear();

      typename T::const_iterator src_beg;
      typename T::const_iterator src_end;
      std::list<std::string>::iterator tgt_beg;

      T src;
      std::list<std::string> tgt;

      taskflow.clear();

      auto from = taskflow.emplace([&](){
        src.resize(N);
        for(auto& d : src) {
          d = ::rand() % 10;
          tgt.emplace_back("hi");
        }
        src_beg = src.begin();
        src_end = src.end();
        tgt_beg = tgt.begin();
      });

      auto to = taskflow.transform(
        std::ref(src_beg), std::ref(src_end), std::ref(tgt_beg),
        [] (const auto& in) {
          return std::to_string(in+10);
        },
        P(c)
      );

      from.precede(to);

      executor.run(taskflow).wait();

      auto s_itr = src.begin();
      auto d_itr = tgt.begin();
      while(s_itr != src.end()) {
        REQUIRE(*d_itr++ == std::to_string(*s_itr++ + 10));
      }
    }
  }
}